

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_tcp.cc
# Opt level: O0

void receive_vector<unsigned_int>
               (server<(connector::CONNECTOR_TYPE)0> *server,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_58;
  char *local_48;
  char *local_38;
  uint local_24;
  uint local_20;
  uint32_t i;
  uint element_memory;
  uint32_t current_vec_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_local;
  server<(connector::CONNECTOR_TYPE)0> *server_local;
  
  _element_memory = (vector<unsigned_int,std::allocator<unsigned_int>> *)vec;
  vec_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)server;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(vec);
  i = 0;
  connector::server<(connector::CONNECTOR_TYPE)0>::receive_tcp<unsigned_int>
            ((server<(connector::CONNECTOR_TYPE)0> *)vec_local,&i);
  poVar1 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
  pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/server_tcp.cc"
                   ,0x2f);
  if (pcVar2 == (char *)0x0) {
    local_38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/server_tcp.cc"
    ;
  }
  else {
    local_38 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/server_tcp.cc"
                       ,0x2f);
    local_38 = local_38 + 1;
  }
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,':');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x21);
  poVar1 = std::operator<<(poVar1,':');
  poVar1 = std::operator<<(poVar1,"receive_vector");
  poVar1 = std::operator<<(poVar1,"()]: ");
  poVar1 = std::operator<<(poVar1,"Got current vec_size: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
  std::operator<<(poVar1,'\n');
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)_element_memory,(ulong)i);
  poVar1 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
  pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/server_tcp.cc"
                   ,0x2f);
  if (pcVar2 == (char *)0x0) {
    local_48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/server_tcp.cc"
    ;
  }
  else {
    local_48 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/server_tcp.cc"
                       ,0x2f);
    local_48 = local_48 + 1;
  }
  poVar1 = std::operator<<(poVar1,local_48);
  poVar1 = std::operator<<(poVar1,':');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x24);
  poVar1 = std::operator<<(poVar1,':');
  poVar1 = std::operator<<(poVar1,"receive_vector");
  poVar1 = std::operator<<(poVar1,"()]: ");
  std::operator<<(poVar1,"Receiving vector:\n");
  for (local_24 = 0; local_24 < i; local_24 = local_24 + 1) {
    connector::server<(connector::CONNECTOR_TYPE)0>::receive_tcp<unsigned_int>
              ((server<(connector::CONNECTOR_TYPE)0> *)vec_local,&local_20);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
              (_element_memory,&local_20);
    poVar1 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/server_tcp.cc"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_58 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/server_tcp.cc"
      ;
    }
    else {
      local_58 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/server_tcp.cc"
                         ,0x2f);
      local_58 = local_58 + 1;
    }
    poVar1 = std::operator<<(poVar1,local_58);
    poVar1 = std::operator<<(poVar1,':');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x2a);
    poVar1 = std::operator<<(poVar1,':');
    poVar1 = std::operator<<(poVar1,"receive_vector");
    poVar1 = std::operator<<(poVar1,"()]: ");
    poVar1 = std::operator<<(poVar1,"    - ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    std::operator<<(poVar1,'\n');
  }
  return;
}

Assistant:

void receive_vector(connector::server< connector::TCP > & server, std::vector< T > & vec)
{   
    // remove all elements from the vector
    vec.clear();
    // preallocate the size "member"
    uint32_t current_vec_size = 0;
    server.receive_tcp< uint32_t >( current_vec_size );
    DEBUG_MSG_CONNECTOR("Got current vec_size: " << current_vec_size << '\n');
    // preallocate space
    vec.reserve(current_vec_size);
    DEBUG_MSG_CONNECTOR("Receiving vector:\n");
    T element_memory;
    for ( uint32_t i = 0; i < current_vec_size; ++i )
    {
        server.receive_tcp< T >( element_memory );
        vec.emplace_back(element_memory);
        DEBUG_MSG_CONNECTOR("    - " << element_memory << '\n');
    }
}